

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O0

void __thiscall OpenMPCriticalDirective::OpenMPCriticalDirective(OpenMPCriticalDirective *this)

{
  OpenMPCriticalDirective *this_local;
  
  OpenMPDirective::OpenMPDirective(&this->super_OpenMPDirective,OMPD_critical,Lang_unknown,0,0);
  std::__cxx11::string::string((string *)&this->critical_name);
  return;
}

Assistant:

OpenMPCriticalDirective( ) : OpenMPDirective(OMPD_critical) { }